

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O2

void TypeCheck_AndOperator(KonohaContext *kctx,KonohaStack *sfp)

{
  kNode *node;
  kNameSpace *ns;
  kNode *pkVar1;
  
  node = sfp[1].field_0.asNode;
  ns = kNode_GetNameSpace(kctx,node);
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_AndOperator",0x1a1,"tracing..");
  pkVar1 = TypeCheckNodeAt(kctx,node,1,ns,
                           *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x18),0);
  if (((pkVar1->nodeType != 0x18) &&
      (pkVar1 = TypeCheckNodeAt(kctx,node,2,ns,
                                *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x18),0),
      pkVar1->nodeType != 0x18)) && (pkVar1 = node, node->nodeType != 0x18)) {
    node->nodeType = 10;
    node->typeAttr = 3;
  }
  sfp[-4].field_0.asNode = pkVar1;
  (*kctx->klib->CheckSafePoint)(kctx,sfp,0);
  return;
}

Assistant:

static KMETHOD TypeCheck_AndOperator(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck2(stmt, expr, ns, reqc);
	kNode *returnNode = TypeCheckNodeAt(kctx, expr, 1, ns, KClass_Boolean, 0);
	if(!kNode_IsError(returnNode)) {
		returnNode = TypeCheckNodeAt(kctx, expr, 2, ns, KClass_Boolean, 0);
		if(!kNode_IsError(returnNode)) {
			returnNode = kNode_Type(expr, KNode_And, KType_Boolean);
		}
	}
	KReturn(returnNode);
}